

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  cmLocalNinjaGenerator *pcVar1;
  int iVar2;
  char *pcVar3;
  string local_40;
  
  cmCommonTargetGenerator::GetFlags
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  iVar2 = std::__cxx11::string::compare((char *)language);
  if (iVar2 == 0) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
  }
  pcVar1 = this->LocalGenerator;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"COMPILE_FLAGS","");
  pcVar3 = cmSourceFile::GetProperty(source,&local_40);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar1,__return_storage_ptr__,pcVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmNinjaTargetGenerator::ComputeFlagsForObject(cmSourceFile const* source,
                                              const std::string& language)
{
  std::string flags = this->GetFlags(language);

  // Add Fortran format flags.
  if(language == "Fortran")
    {
    this->AppendFortranFormatFlags(flags, *source);
    }

  // Add source file specific flags.
  this->LocalGenerator->AppendFlags(flags,
    source->GetProperty("COMPILE_FLAGS"));

  return flags;
}